

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O3

int __thiscall jrtplib::RTPUDPv6Transmitter::PollSocket(RTPUDPv6Transmitter *this,bool rtp)

{
  size_t *psVar1;
  RTPMemoryManager *pRVar2;
  in6_addr srcip;
  int iVar3;
  ssize_t sVar4;
  _List_node_base *p_Var5;
  _List_node_base *__dest;
  _List_node_base *p_Var6;
  undefined7 in_register_00000031;
  _List_node_base *__n;
  bool bVar7;
  int sock;
  uint fromlen;
  size_t len;
  timespec tpMono;
  sockaddr_in6 srcaddr;
  timespec tpMono_1;
  char packetbuffer [65535];
  int aiStack_100a8 [2];
  long lStack_100a0;
  int iStack_10098;
  undefined4 uStack_10094;
  timespec tStack_10090;
  _List_node_base *p_Stack_10080;
  list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_> *plStack_10078;
  _List_node_base *p_Stack_10070;
  sockaddr sStack_10064;
  undefined4 uStack_10054;
  undefined4 uStack_10050;
  timespec tStack_10048;
  int8_t aiStack_10038 [65544];
  
  aiStack_100a8[0] = *(int *)((long)(this->destinations).table + (ulong)!rtp * 4 + -0x5c);
  lStack_100a0 = 0;
  ioctl(aiStack_100a8[0],0x541b,&lStack_100a0);
  bVar7 = true;
  if (lStack_100a0 == 0) {
    iVar3 = RTPSelect(aiStack_100a8,aiStack_10038,1,(RTPTime)0x0);
    bVar7 = false;
    if (iVar3 < 0) {
      return iVar3;
    }
  }
  iStack_10098 = 2 - (uint)rtp;
  plStack_10078 = &this->rawpacketlist;
  p_Stack_10070 = (_List_node_base *)&PTR_CreateCopy_0013cb40;
  uStack_10094 = (int)CONCAT71(in_register_00000031,rtp);
  do {
    if (!bVar7) {
      return 0;
    }
    do {
      if (RTPTime::CurrentTime()::s_initialized == '\0') {
        RTPTime::CurrentTime()::s_initialized = '\x01';
        clock_gettime(0,&tStack_10090);
        clock_gettime(1,&tStack_10048);
        p_Stack_10080 =
             (_List_node_base *)
             ((double)tStack_10090.tv_nsec * 1e-09 +
             (double)CONCAT71(tStack_10090.tv_sec._1_7_,(char)tStack_10090.tv_sec));
        RTPTime::CurrentTime()::s_startOffet =
             (double)p_Stack_10080 -
             ((double)tStack_10048.tv_nsec * 1e-09 + (double)tStack_10048.tv_sec);
      }
      else {
        clock_gettime(1,&tStack_10090);
        p_Stack_10080 =
             (_List_node_base *)
             ((double)tStack_10090.tv_nsec * 1e-09 +
              (double)CONCAT71(tStack_10090.tv_sec._1_7_,(char)tStack_10090.tv_sec) +
             RTPTime::CurrentTime()::s_startOffet);
      }
      aiStack_100a8[1] = 0x1c;
      sVar4 = recvfrom(aiStack_100a8[0],aiStack_10038,0xffff,0,&sStack_10064,
                       (socklen_t *)(aiStack_100a8 + 1));
      if ((0 < (int)(uint)sVar4) &&
         ((this->receivemode == AcceptAll ||
          (srcip.__in6_u._4_1_ = sStack_10064.sa_data[10],
          srcip.__in6_u._5_1_ = sStack_10064.sa_data[0xb],
          srcip.__in6_u._6_1_ = sStack_10064.sa_data[0xc],
          srcip.__in6_u._7_1_ = sStack_10064.sa_data[0xd],
          srcip.__in6_u._0_1_ = sStack_10064.sa_data[6],
          srcip.__in6_u._1_1_ = sStack_10064.sa_data[7],
          srcip.__in6_u._2_1_ = sStack_10064.sa_data[8],
          srcip.__in6_u._3_1_ = sStack_10064.sa_data[9], srcip.__in6_u.__u6_addr32[2] = uStack_10054
          , srcip.__in6_u.__u6_addr32[3] = uStack_10050,
          bVar7 = ShouldAcceptData(this,srcip,
                                   sStack_10064.sa_data._0_2_ << 8 |
                                   (ushort)sStack_10064.sa_data._0_2_ >> 8), bVar7)))) {
        pRVar2 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
        if (pRVar2 == (RTPMemoryManager *)0x0) {
          p_Var5 = (_List_node_base *)operator_new(0x20);
        }
        else {
          p_Var5 = (_List_node_base *)(**(code **)(*(long *)pRVar2 + 0x10))(pRVar2,0x20,0x17);
        }
        *(undefined4 *)&p_Var5->_M_prev = 1;
        p_Var5->_M_next = p_Stack_10070;
        *(undefined4 *)((long)&p_Var5->_M_prev + 4) = sStack_10064.sa_data._6_4_;
        *(undefined4 *)&p_Var5[1]._M_next = sStack_10064.sa_data._10_4_;
        *(undefined4 *)((long)&p_Var5[1]._M_next + 4) = uStack_10054;
        *(undefined4 *)&p_Var5[1]._M_prev = uStack_10050;
        *(ushort *)((long)&p_Var5[1]._M_prev + 4) =
             sStack_10064.sa_data._0_2_ << 8 | (ushort)sStack_10064.sa_data._0_2_ >> 8;
        __n = (_List_node_base *)(ulong)((uint)sVar4 & 0x7fffffff);
        pRVar2 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
        if (pRVar2 == (RTPMemoryManager *)0x0) {
          __dest = (_List_node_base *)operator_new__((ulong)__n);
        }
        else {
          __dest = (_List_node_base *)(**(code **)(*(long *)pRVar2 + 0x10))(pRVar2,__n,iStack_10098)
          ;
          if (__dest == (_List_node_base *)0x0) {
            pRVar2 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
            if (pRVar2 == (RTPMemoryManager *)0x0) {
              (*(code *)p_Var5->_M_next[2]._M_next)(p_Var5);
            }
            else {
              (*(code *)p_Var5->_M_next[1]._M_prev)(p_Var5);
              (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,p_Var5);
            }
            return -1;
          }
        }
        memcpy(__dest,aiStack_10038,(size_t)__n);
        pRVar2 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
        if (pRVar2 == (RTPMemoryManager *)0x0) {
          p_Var6 = (_List_node_base *)operator_new(0x38);
        }
        else {
          p_Var6 = (_List_node_base *)(**(code **)(*(long *)pRVar2 + 0x10))(pRVar2,0x38,0x1b);
        }
        p_Var6->_M_prev = (_List_node_base *)(this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
        p_Var6->_M_next = (_List_node_base *)&PTR__RTPRawPacket_0013c050;
        p_Var6[2]._M_next = p_Stack_10080;
        p_Var6[1]._M_next = __dest;
        p_Var6[1]._M_prev = __n;
        p_Var6[2]._M_prev = p_Var5;
        *(char *)&p_Var6[3]._M_next = (char)uStack_10094;
        p_Var5 = (_List_node_base *)operator_new(0x18);
        p_Var5[1]._M_next = p_Var6;
        std::__detail::_List_node_base::_M_hook(p_Var5);
        psVar1 = &(this->rawpacketlist).
                  super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
      }
      lStack_100a0 = 0;
      ioctl(aiStack_100a8[0],0x541b,&lStack_100a0);
    } while (lStack_100a0 != 0);
    tStack_10090.tv_sec._0_1_ = '\0';
    iVar3 = RTPSelect(aiStack_100a8,(int8_t *)&tStack_10090,1,(RTPTime)0x0);
    bVar7 = (char)tStack_10090.tv_sec != '\0';
  } while (-1 < iVar3);
  return iVar3;
}

Assistant:

int RTPUDPv6Transmitter::PollSocket(bool rtp)
{
	RTPSOCKLENTYPE fromlen;
	int recvlen;
	char packetbuffer[RTPUDPV6TRANS_MAXPACKSIZE];
#ifdef RTP_SOCKETTYPE_WINSOCK
	SOCKET sock;
	unsigned long len;
#else 
	size_t len;
	int sock;
#endif // RTP_SOCKETTYPE_WINSOCK
	struct sockaddr_in6 srcaddr;
	bool dataavailable;
	
	if (rtp)
		sock = rtpsock;
	else
		sock = rtcpsock;
	
	len = 0;
	RTPIOCTL(sock,FIONREAD,&len);

	if (len <= 0) // make sure a packet of length zero is not queued
	{
		int8_t isset = 0;
		int status = RTPSelect(&sock, &isset, 1, RTPTime(0));
		if (status < 0)
			return status;

		if (isset)
			dataavailable = true;
		else
			dataavailable = false;
	}
	else
		dataavailable = true;

	while (dataavailable)
	{
		RTPTime curtime = RTPTime::CurrentTime();
		fromlen = sizeof(struct sockaddr_in6);
		recvlen = recvfrom(sock,packetbuffer,RTPUDPV6TRANS_MAXPACKSIZE,0,(struct sockaddr *)&srcaddr,&fromlen);
		if (recvlen > 0)
		{
			bool acceptdata;

			// got data, process it
			if (receivemode == RTPTransmitter::AcceptAll)
				acceptdata = true;
			else
				acceptdata = ShouldAcceptData(srcaddr.sin6_addr,ntohs(srcaddr.sin6_port));
			
			if (acceptdata)
			{
				RTPRawPacket *pack;
				RTPIPv6Address *addr;
				uint8_t *datacopy;

				addr = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPADDRESS) RTPIPv6Address(srcaddr.sin6_addr,ntohs(srcaddr.sin6_port));
				if (addr == 0)
					return ERR_RTP_OUTOFMEM;
				datacopy = RTPNew(GetMemoryManager(),(rtp)?RTPMEM_TYPE_BUFFER_RECEIVEDRTPPACKET:RTPMEM_TYPE_BUFFER_RECEIVEDRTCPPACKET) uint8_t[recvlen];
				if (datacopy == 0)
				{
					RTPDelete(addr,GetMemoryManager());
					return ERR_RTP_OUTOFMEM;
				}
				memcpy(datacopy,packetbuffer,recvlen);
				
				pack = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPRAWPACKET) RTPRawPacket(datacopy,recvlen,addr,curtime,rtp,GetMemoryManager());
				if (pack == 0)
				{
					RTPDelete(addr,GetMemoryManager());
					RTPDeleteByteArray(datacopy,GetMemoryManager());
					return ERR_RTP_OUTOFMEM;
				}
				rawpacketlist.push_back(pack);	
			}
		}
		len = 0;
		RTPIOCTL(sock,FIONREAD,&len);

		if (len <= 0) // make sure a packet of length zero is not queued
		{
			int8_t isset = 0;
			int status = RTPSelect(&sock, &isset, 1, RTPTime(0));
			if (status < 0)
				return status;

			if (isset)
				dataavailable = true;
			else
				dataavailable = false;
		}
		else
			dataavailable = true;
	}
	return 0;
}